

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContextTlsEntry.cpp
# Opt level: O0

ThreadContextTLSEntry * ThreadContextTLSEntry::CreateEntryForCurrentThread(void)

{
  ThreadContextTLSEntry *pTVar1;
  HeapAllocator *alloc;
  long lVar2;
  TrackAllocData local_38;
  ThreadContextTLSEntry *local_10;
  ThreadContextTLSEntry *entry;
  
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContextTlsEntry.cpp"
             ,0xbb);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
  local_10 = (ThreadContextTLSEntry *)new<Memory::HeapAllocator>(0x18,alloc,0x449f70);
  StackProber::Initialize(&local_10->prober);
  pTVar1 = local_10;
  lVar2 = __tls_get_addr(&PTR_01e57de8);
  *(ThreadContextTLSEntry **)(lVar2 + 0x90) = pTVar1;
  return local_10;
}

Assistant:

ThreadContextTLSEntry * ThreadContextTLSEntry::CreateEntryForCurrentThread()
{
    ASSERT_ENTRY_INITIALIZED();
#ifdef _WIN32
    Assert(TlsGetValue(s_tlsSlot) == NULL);
#endif

    ThreadContextTLSEntry * entry = HeapNewStructZ(ThreadContextTLSEntry);
#pragma prefast(suppress:6001, "Memory from HeapNewStructZ are zero initialized")
    entry->prober.Initialize();
    TlsSetValue(s_tlsSlot, entry);

    return entry;
}